

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O2

string * cfd::js::api::json::JsonMappingApi::VerifySign
                   (string *__return_storage_ptr__,string *request_message)

{
  code *local_48 [2];
  code *local_38;
  code *local_30;
  undefined1 local_28 [24];
  code *local_10;
  
  local_28._8_8_ = 0;
  local_28._0_8_ = TransactionStructApi::VerifySign;
  local_10 = std::
             _Function_handler<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&),_cfd::js::api::VerifySignResponseStruct_(*)(const_cfd::js::api::VerifySignRequestStruct_&)>
             ::_M_invoke;
  local_28._16_8_ =
       std::
       _Function_handler<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&),_cfd::js::api::VerifySignResponseStruct_(*)(const_cfd::js::api::VerifySignRequestStruct_&)>
       ::_M_manager;
  local_48[1] = (code *)0x0;
  local_48[0] = ElementsTransactionStructApi::VerifySign;
  local_30 = std::
             _Function_handler<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&),_cfd::js::api::VerifySignResponseStruct_(*)(const_cfd::js::api::VerifySignRequestStruct_&)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&),_cfd::js::api::VerifySignResponseStruct_(*)(const_cfd::js::api::VerifySignRequestStruct_&)>
             ::_M_manager;
  ExecuteElementsCheckApi<cfd::js::api::json::VerifySignRequest,cfd::js::api::json::VerifySignResponse,cfd::js::api::VerifySignRequestStruct,cfd::js::api::VerifySignResponseStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,
             (function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
              *)local_48,
             (function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
              *)ElementsTransactionStructApi::VerifySign);
  std::_Function_base::~_Function_base((_Function_base *)local_48);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::VerifySign(const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::VerifySignRequest, api::json::VerifySignResponse,
      api::VerifySignRequestStruct, api::VerifySignResponseStruct>(
      request_message, TransactionStructApi::VerifySign,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionStructApi::VerifySign);
#else
      TransactionStructApi::VerifySign);
#endif
}